

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O0

Abc_TtStore_t * Abc_TruthStoreAlloc(int nVars,int nFuncs)

{
  Abc_TtStore_t *pAVar1;
  word **ppwVar2;
  word *pwVar3;
  int local_20;
  int local_1c;
  int i;
  Abc_TtStore_t *p;
  int nFuncs_local;
  int nVars_local;
  
  pAVar1 = (Abc_TtStore_t *)malloc(0x18);
  pAVar1->nVars = nVars;
  if (nVars < 7) {
    local_20 = 1;
  }
  else {
    local_20 = 1 << ((char)nVars - 6U & 0x1f);
  }
  pAVar1->nWords = local_20;
  pAVar1->nFuncs = nFuncs;
  ppwVar2 = (word **)malloc((long)pAVar1->nFuncs << 3);
  pAVar1->pFuncs = ppwVar2;
  pwVar3 = (word *)calloc(8,(long)(pAVar1->nFuncs * pAVar1->nWords));
  *pAVar1->pFuncs = pwVar3;
  for (local_1c = 1; local_1c < pAVar1->nFuncs; local_1c = local_1c + 1) {
    pAVar1->pFuncs[local_1c] = pAVar1->pFuncs[local_1c + -1] + pAVar1->nWords;
  }
  return pAVar1;
}

Assistant:

static Rpo_TtStore_t * Abc_TruthStoreAlloc(int nVars, int nFuncs) {
    Rpo_TtStore_t * p;
    int i;
    p = (Rpo_TtStore_t *) malloc(sizeof (Rpo_TtStore_t));
    p->nVars = nVars;
    p->nWords = (nVars < 7) ? 1 : (1 << (nVars - 6));
    p->nFuncs = nFuncs;
    // alloc storage for 'nFuncs' truth tables as one chunk of memory
    p->pFuncs = (word **) malloc((sizeof (word *) + sizeof (word) * p->nWords) * p->nFuncs);
    // assign and clean the truth table storage
    p->pFuncs[0] = (word *) (p->pFuncs + p->nFuncs);
    memset(p->pFuncs[0], 0, sizeof (word) * p->nWords * p->nFuncs);
    // split it up into individual truth tables
    for (i = 1; i < p->nFuncs; i++)
        p->pFuncs[i] = p->pFuncs[i - 1] + p->nWords;
    return p;
}